

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_82a95::CleanDeadTestCleanDead::Run(CleanDeadTestCleanDead *this)

{
  State *state_00;
  VirtualFileSystem *pVVar1;
  BuildConfig *config;
  DyndepLoader *pDVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  DyndepLoader *pDVar4;
  int iVar5;
  Test *pTVar6;
  bool bVar7;
  int iVar8;
  LoadStatus LVar9;
  LogEntry *pLVar10;
  TimeStamp TVar11;
  string err;
  Cleaner cleaner2;
  Cleaner cleaner1;
  BuildLog log2;
  BuildLog log1;
  State state;
  string local_380;
  VirtualFileSystem *local_360;
  string local_358;
  Cleaner local_338;
  Cleaner local_2a0;
  BuildLog local_208;
  BuildLog local_1a0;
  State local_138;
  
  State::State(&local_138);
  iVar8 = g_current_test->assertion_failures_;
  AssertParse(&local_138,
              "rule cat\n  command = cat $in > $out\nbuild out1: cat in\nbuild out2: cat in\n",
              (ManifestParserOptions)0x0);
  iVar5 = g_current_test->assertion_failures_;
  if (iVar8 != iVar5) {
    g_current_test->assertion_failures_ = iVar5 + 1;
    goto LAB_00149774;
  }
  state_00 = &(this->super_CleanDeadTest).super_CleanTest.super_StateTestWithBuiltinRules.state_;
  AssertParse(state_00,"build out2: cat in\n",(ManifestParserOptions)0x0);
  if (iVar5 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00149774;
  }
  pDVar4 = &local_2a0.dyndep_loader_;
  local_2a0.state_ = (State *)pDVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"in","");
  pDVar2 = &local_338.dyndep_loader_;
  local_338.state_ = (State *)pDVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
  pVVar1 = &(this->super_CleanDeadTest).super_CleanTest.fs_;
  VirtualFileSystem::Create(pVVar1,(string *)&local_2a0,(string *)&local_338);
  if (local_338.state_ != (State *)pDVar2) {
    operator_delete(local_338.state_,
                    (ulong)((long)&((local_338.dyndep_loader_.state_)->paths_)._M_h + 1));
  }
  if (local_2a0.state_ != (State *)pDVar4) {
    operator_delete(local_2a0.state_,
                    (ulong)((long)&((local_2a0.dyndep_loader_.state_)->paths_)._M_h + 1));
  }
  local_2a0.state_ = (State *)pDVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"out1","");
  local_338.state_ = (State *)pDVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
  VirtualFileSystem::Create(pVVar1,(string *)&local_2a0,(string *)&local_338);
  if (local_338.state_ != (State *)pDVar2) {
    operator_delete(local_338.state_,
                    (ulong)((long)&((local_338.dyndep_loader_.state_)->paths_)._M_h + 1));
  }
  if (local_2a0.state_ != (State *)pDVar4) {
    operator_delete(local_2a0.state_,
                    (ulong)((long)&((local_2a0.dyndep_loader_.state_)->paths_)._M_h + 1));
  }
  local_2a0.state_ = (State *)pDVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"out2","");
  local_338.state_ = (State *)pDVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
  VirtualFileSystem::Create(pVVar1,(string *)&local_2a0,(string *)&local_338);
  if (local_338.state_ != (State *)pDVar2) {
    operator_delete(local_338.state_,
                    (ulong)((long)&((local_338.dyndep_loader_.state_)->paths_)._M_h + 1));
  }
  if (local_2a0.state_ != (State *)pDVar4) {
    operator_delete(local_2a0.state_,
                    (ulong)((long)&((local_2a0.dyndep_loader_.state_)->paths_)._M_h + 1));
  }
  BuildLog::BuildLog(&local_1a0);
  pTVar6 = g_current_test;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  local_2a0.state_ = (State *)pDVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"CleanTest-tempfile","");
  bVar7 = BuildLog::OpenForWrite
                    (&local_1a0,(string *)&local_2a0,&(this->super_CleanDeadTest).super_BuildLogUser
                     ,&local_358);
  testing::Test::Check
            (pTVar6,bVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
             ,0x1f2,"log1.OpenForWrite(kTestFilename, *this, &err)");
  if (local_2a0.state_ != (State *)pDVar4) {
    operator_delete(local_2a0.state_,
                    (ulong)((long)&((local_2a0.dyndep_loader_.state_)->paths_)._M_h + 1));
  }
  pTVar6 = g_current_test;
  iVar8 = std::__cxx11::string::compare((char *)&local_358);
  bVar7 = testing::Test::Check
                    (pTVar6,iVar8 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                     ,499,"\"\" == err");
  if (bVar7) {
    BuildLog::RecordCommand
              (&local_1a0,
               *local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Vector_impl_data._M_start,0xf,0x12,0);
    BuildLog::RecordCommand
              (&local_1a0,
               local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
               super__Vector_impl_data._M_start[1],0x14,0x19,0);
    BuildLog::Close(&local_1a0);
    BuildLog::BuildLog(&local_208);
    pTVar6 = g_current_test;
    local_2a0.state_ = (State *)pDVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"CleanTest-tempfile","");
    LVar9 = BuildLog::Load(&local_208,(string *)&local_2a0,&local_358);
    testing::Test::Check
              (pTVar6,LVar9 != LOAD_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0x1f9,"log2.Load(kTestFilename, &err)");
    if (local_2a0.state_ != (State *)pDVar4) {
      operator_delete(local_2a0.state_,
                      (ulong)((long)&((local_2a0.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    pTVar6 = g_current_test;
    iVar8 = std::__cxx11::string::compare((char *)&local_358);
    bVar7 = testing::Test::Check
                      (pTVar6,iVar8 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x1fa,"\"\" == err");
    if (bVar7) {
      bVar7 = testing::Test::Check
                        (g_current_test,local_208.entries_._M_h._M_element_count == 2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                         ,0x1fb,"2u == log2.entries().size()");
      pTVar6 = g_current_test;
      if (bVar7) {
        local_360 = pVVar1;
        local_2a0.state_ = (State *)pDVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"out1","");
        pLVar10 = BuildLog::LookupByOutput(&local_208,(string *)&local_2a0);
        bVar7 = testing::Test::Check
                          (pTVar6,pLVar10 != (LogEntry *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x1fc,"log2.LookupByOutput(\"out1\")");
        if (local_2a0.state_ != (State *)pDVar4) {
          operator_delete(local_2a0.state_,
                          (ulong)((long)&((local_2a0.dyndep_loader_.state_)->paths_)._M_h + 1));
        }
        pTVar6 = g_current_test;
        if (bVar7) {
          local_2a0.state_ = (State *)pDVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"out2","");
          pLVar10 = BuildLog::LookupByOutput(&local_208,(string *)&local_2a0);
          bVar7 = testing::Test::Check
                            (pTVar6,pLVar10 != (LogEntry *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                             ,0x1fd,"log2.LookupByOutput(\"out2\")");
          if (local_2a0.state_ != (State *)pDVar4) {
            operator_delete(local_2a0.state_,
                            (ulong)((long)&((local_2a0.dyndep_loader_.state_)->paths_)._M_h + 1));
          }
          if (bVar7) {
            config = &(this->super_CleanDeadTest).super_CleanTest.config_;
            Cleaner::Cleaner(&local_2a0,&local_138,config,&local_360->super_DiskInterface);
            pTVar6 = g_current_test;
            iVar8 = Cleaner::CleanDead(&local_2a0,&local_208.entries_);
            testing::Test::Check
                      (pTVar6,iVar8 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x201,"0 == cleaner1.CleanDead(log2.entries())");
            testing::Test::Check
                      (g_current_test,local_2a0.cleaned_files_count_ == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x202,"0 == cleaner1.cleaned_files_count()");
            testing::Test::Check
                      (g_current_test,
                       *(size_t *)
                        ((long)&(this->super_CleanDeadTest).super_CleanTest.fs_.files_removed_._M_t.
                                _M_impl.super__Rb_tree_header + 0x20) == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x203,"0u == fs_.files_removed_.size()");
            pTVar6 = g_current_test;
            local_338.state_ = (State *)&local_338.dyndep_loader_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"in","");
            TVar11 = VirtualFileSystem::Stat(local_360,(string *)&local_338,&local_358);
            testing::Test::Check
                      (pTVar6,TVar11 != 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x204,"0 != fs_.Stat(\"in\", &err)");
            if (local_338.state_ != (State *)&local_338.dyndep_loader_) {
              operator_delete(local_338.state_,
                              (ulong)((long)&((local_338.dyndep_loader_.state_)->paths_)._M_h + 1));
            }
            pTVar6 = g_current_test;
            local_338.state_ = (State *)&local_338.dyndep_loader_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"out1","");
            TVar11 = VirtualFileSystem::Stat(local_360,(string *)&local_338,&local_358);
            testing::Test::Check
                      (pTVar6,TVar11 != 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x205,"0 != fs_.Stat(\"out1\", &err)");
            if (local_338.state_ != (State *)&local_338.dyndep_loader_) {
              operator_delete(local_338.state_,
                              (ulong)((long)&((local_338.dyndep_loader_.state_)->paths_)._M_h + 1));
            }
            pTVar6 = g_current_test;
            local_338.state_ = (State *)&local_338.dyndep_loader_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"out2","");
            TVar11 = VirtualFileSystem::Stat(local_360,(string *)&local_338,&local_358);
            testing::Test::Check
                      (pTVar6,TVar11 != 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x206,"0 != fs_.Stat(\"out2\", &err)");
            if (local_338.state_ != (State *)&local_338.dyndep_loader_) {
              operator_delete(local_338.state_,
                              (ulong)((long)&((local_338.dyndep_loader_.state_)->paths_)._M_h + 1));
            }
            pVVar1 = local_360;
            Cleaner::Cleaner(&local_338,state_00,config,&local_360->super_DiskInterface);
            pTVar6 = g_current_test;
            iVar8 = Cleaner::CleanDead(&local_338,&local_208.entries_);
            testing::Test::Check
                      (pTVar6,iVar8 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x20a,"0 == cleaner2.CleanDead(log2.entries())");
            testing::Test::Check
                      (g_current_test,local_338.cleaned_files_count_ == 1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x20b,"1 == cleaner2.cleaned_files_count()");
            testing::Test::Check
                      (g_current_test,
                       *(size_t *)
                        ((long)&(this->super_CleanDeadTest).super_CleanTest.fs_.files_removed_._M_t.
                                _M_impl.super__Rb_tree_header + 0x20) == 1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x20c,"1u == fs_.files_removed_.size()");
            pTVar6 = g_current_test;
            iVar8 = std::__cxx11::string::compare
                              ((char *)(*(_Base_ptr *)
                                         ((long)&(this->super_CleanDeadTest).super_CleanTest.fs_.
                                                 files_removed_._M_t._M_impl.super__Rb_tree_header +
                                         0x10) + 1));
            testing::Test::Check
                      (pTVar6,iVar8 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x20d,"\"out1\" == *(fs_.files_removed_.begin())");
            pTVar6 = g_current_test;
            paVar3 = &local_380.field_2;
            local_380._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"in","");
            TVar11 = VirtualFileSystem::Stat(pVVar1,&local_380,&local_358);
            testing::Test::Check
                      (pTVar6,TVar11 != 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x20e,"0 != fs_.Stat(\"in\", &err)");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != paVar3) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            pTVar6 = g_current_test;
            local_380._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"out1","");
            TVar11 = VirtualFileSystem::Stat(pVVar1,&local_380,&local_358);
            testing::Test::Check
                      (pTVar6,TVar11 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x20f,"0 == fs_.Stat(\"out1\", &err)");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != paVar3) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            pTVar6 = g_current_test;
            local_380._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"out2","");
            TVar11 = VirtualFileSystem::Stat(pVVar1,&local_380,&local_358);
            testing::Test::Check
                      (pTVar6,TVar11 != 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x210,"0 != fs_.Stat(\"out2\", &err)");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != paVar3) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            pTVar6 = g_current_test;
            iVar8 = Cleaner::CleanDead(&local_338,&local_208.entries_);
            testing::Test::Check
                      (pTVar6,iVar8 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x213,"0 == cleaner2.CleanDead(log2.entries())");
            testing::Test::Check
                      (g_current_test,local_338.cleaned_files_count_ == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x214,"0 == cleaner2.cleaned_files_count()");
            testing::Test::Check
                      (g_current_test,
                       *(size_t *)
                        ((long)&(this->super_CleanDeadTest).super_CleanTest.fs_.files_removed_._M_t.
                                _M_impl.super__Rb_tree_header + 0x20) == 1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x215,"1u == fs_.files_removed_.size()");
            pTVar6 = g_current_test;
            iVar8 = std::__cxx11::string::compare
                              ((char *)(*(_Base_ptr *)
                                         ((long)&(this->super_CleanDeadTest).super_CleanTest.fs_.
                                                 files_removed_._M_t._M_impl.super__Rb_tree_header +
                                         0x10) + 1));
            testing::Test::Check
                      (pTVar6,iVar8 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x216,"\"out1\" == *(fs_.files_removed_.begin())");
            pTVar6 = g_current_test;
            local_380._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"in","");
            TVar11 = VirtualFileSystem::Stat(pVVar1,&local_380,&local_358);
            testing::Test::Check
                      (pTVar6,TVar11 != 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x217,"0 != fs_.Stat(\"in\", &err)");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != paVar3) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            pTVar6 = g_current_test;
            local_380._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"out1","");
            TVar11 = VirtualFileSystem::Stat(pVVar1,&local_380,&local_358);
            testing::Test::Check
                      (pTVar6,TVar11 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x218,"0 == fs_.Stat(\"out1\", &err)");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != paVar3) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            pTVar6 = g_current_test;
            local_380._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"out2","");
            TVar11 = VirtualFileSystem::Stat(pVVar1,&local_380,&local_358);
            testing::Test::Check
                      (pTVar6,TVar11 != 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x219,"0 != fs_.Stat(\"out2\", &err)");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != paVar3) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            BuildLog::Close(&local_208);
            std::
            _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
            ::~_Rb_tree(&local_338.cleaned_._M_t);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_338.removed_._M_t);
            std::
            _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
            ::~_Rb_tree(&local_2a0.cleaned_._M_t);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_2a0.removed_._M_t);
          }
          else {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
          goto LAB_0014973e;
        }
      }
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
LAB_0014973e:
    BuildLog::~BuildLog(&local_208);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,
                    CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                             local_358.field_2._M_local_buf[0]) + 1);
  }
  BuildLog::~BuildLog(&local_1a0);
LAB_00149774:
  if (local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_138.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d8ce8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_138.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_138.bindings_.bindings_._M_t);
  if (local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_138.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_138);
  return;
}

Assistant:

TEST_F(CleanDeadTest, CleanDead) {
  State state;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state,
"rule cat\n"
"  command = cat $in > $out\n"
"build out1: cat in\n"
"build out2: cat in\n"
));
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out2: cat in\n"
));
  fs_.Create("in", "");
  fs_.Create("out1", "");
  fs_.Create("out2", "");

  BuildLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, *this, &err));
  ASSERT_EQ("", err);
  log1.RecordCommand(state.edges_[0], 15, 18);
  log1.RecordCommand(state.edges_[1], 20, 25);
  log1.Close();

  BuildLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(2u, log2.entries().size());
  ASSERT_TRUE(log2.LookupByOutput("out1"));
  ASSERT_TRUE(log2.LookupByOutput("out2"));

  // First use the manifest that describe how to build out1.
  Cleaner cleaner1(&state, config_, &fs_);
  EXPECT_EQ(0, cleaner1.CleanDead(log2.entries()));
  EXPECT_EQ(0, cleaner1.cleaned_files_count());
  EXPECT_EQ(0u, fs_.files_removed_.size());
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_NE(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));

  // Then use the manifest that does not build out1 anymore.
  Cleaner cleaner2(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner2.CleanDead(log2.entries()));
  EXPECT_EQ(1, cleaner2.cleaned_files_count());
  EXPECT_EQ(1u, fs_.files_removed_.size());
  EXPECT_EQ("out1", *(fs_.files_removed_.begin()));
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_EQ(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));

  // Nothing to do now.
  EXPECT_EQ(0, cleaner2.CleanDead(log2.entries()));
  EXPECT_EQ(0, cleaner2.cleaned_files_count());
  EXPECT_EQ(1u, fs_.files_removed_.size());
  EXPECT_EQ("out1", *(fs_.files_removed_.begin()));
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_EQ(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));
  log2.Close();
}